

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker3F1S.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  jsmntok_t *pjVar1;
  int iVar2;
  int port;
  WorkerFlow *this;
  WorkerCallback *this_00;
  undefined8 extraout_RAX;
  size_t i;
  string filename;
  string flow_connect;
  WorkerStream ws;
  string flow_name;
  JSONObject flow_config;
  string default_connect;
  string config_file;
  JSONObject config;
  JSONParser parser;
  JSONArray flows_config;
  string local_248;
  int local_224;
  string local_220;
  undefined1 local_200 [32];
  _Base_ptr local_1e0;
  size_t local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  JSONObject local_130;
  string local_118;
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  JSONObject local_b8;
  JSONParser local_a0;
  JSONElement local_60;
  JSONArray local_48;
  
  if (argc == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)&local_a0);
    JSONParser::JSONParser(&local_a0);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f8,local_d8,local_d0 + (long)local_d8);
    JSONParser::load_file(&local_a0,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    JSONParser::parse((JSONElement *)local_200,&local_a0);
    JSONElement::operator_cast_to_JSONObject(&local_b8,(JSONElement *)local_200);
    pjVar1 = (jsmntok_t *)(local_200 + 0x10);
    local_200._0_8_ = pjVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"bind","");
    JSONObject::operator[]((JSONElement *)&local_1b0,&local_b8,(string *)local_200);
    JSONElement::operator_cast_to_string(&local_118,(JSONElement *)&local_1b0);
    if ((jsmntok_t *)local_200._0_8_ != pjVar1) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    local_200._0_8_ = pjVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"flows","");
    JSONObject::operator[]((JSONElement *)&local_1b0,&local_b8,(string *)local_200);
    JSONElement::operator_cast_to_JSONArray(&local_48,(JSONElement *)&local_1b0);
    if ((jsmntok_t *)local_200._0_8_ != pjVar1) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    local_200._0_8_ = pjVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"buffsize","");
    JSONObject::operator[]((JSONElement *)&local_1b0,&local_b8,(string *)local_200);
    local_224 = JSONElement::operator_cast_to_int((JSONElement *)&local_1b0);
    if ((jsmntok_t *)local_200._0_8_ != pjVar1) {
      operator_delete((void *)local_200._0_8_,(ulong)(local_200._16_8_ + 1));
    }
    local_200._24_8_ = local_200 + 8;
    local_200._8_4_ = _S_red;
    i = 0;
    local_200._16_8_ = (char *)0x0;
    local_1d8 = 0;
    local_1e0 = (_Base_ptr)local_200._24_8_;
    do {
      JSONArray::operator[]((JSONElement *)&local_1b0,&local_48,i);
      JSONElement::operator_cast_to_JSONObject(&local_130,(JSONElement *)&local_1b0);
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"name","");
      JSONObject::operator[]((JSONElement *)&local_248,&local_130,&local_220);
      JSONElement::operator_cast_to_string(&local_1b0,(JSONElement *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_220,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"bind","");
      JSONObject::operator[](&local_60,&local_130,&local_1d0);
      JSONElement::operator_cast_to_string(&local_248,&local_60);
      std::__cxx11::string::operator=((string *)&local_220,(string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"buffsize","");
      JSONObject::operator[]((JSONElement *)&local_1d0,&local_130,&local_248);
      iVar2 = JSONElement::operator_cast_to_int((JSONElement *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"port","");
      JSONObject::operator[]((JSONElement *)&local_1d0,&local_130,&local_248);
      port = JSONElement::operator_cast_to_int((JSONElement *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"file","");
      JSONObject::operator[](&local_60,&local_130,&local_1d0);
      JSONElement::operator_cast_to_string(&local_248,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_190,local_1b0._M_dataplus._M_p,
                 local_1b0._M_dataplus._M_p + local_1b0._M_string_length);
      local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_220._M_dataplus._M_p,
                 local_220._M_dataplus._M_p + local_220._M_string_length);
      this = WorkerStream::create_flow
                       ((WorkerStream *)local_200,&local_190,&local_150,port,(long)iVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
      this_00 = (WorkerCallback *)operator_new(0x10);
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,local_248._M_dataplus._M_p,
                 local_248._M_dataplus._M_p + local_248._M_string_length);
      WorkerCallback::WorkerCallback(this_00,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
      WorkerFlow::set_callback(this,(Callback *)this_00);
      WorkerFlow::own_callback(this);
      std::__cxx11::string::_M_assign((string *)&local_248);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      i = i + 1;
    } while (i != 3);
    WorkerStream::start((WorkerStream *)local_200);
    WorkerStream::~WorkerStream((WorkerStream *)local_200);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    JSONParser::~JSONParser(&local_a0);
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
    return 0;
  }
  usage(argv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  WorkerStream::~WorkerStream((WorkerStream *)local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  JSONParser::~JSONParser(&local_a0);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main(int argc, char **argv)
{
    size_t buffsize = 2048;

    if (argc != 2) {
        usage(argv);
    }
    std::string config_file(argv[1]);

    // Parse config file (assume it has no errors)
    JSONParser parser;
    parser.load_file(config_file);
    JSONObject config = parser.parse();

    // REQUIRED: default connect
    std::string default_connect = config["bind"];
    JSONArray flows_config = config["flows"];
    try {
        buffsize = (int)config["buffsize"];
    } catch (JSMNUtilsEx &ex) {
        // buffsize stays default
    }
    // Initialize WorkerStream
    WorkerStream ws;

    for (int i = 0; i < N_THREADS; i++) {
        JSONObject flow_config = flows_config[i];
        std::string flow_name = flow_config["name"];
        std::string flow_connect = default_connect;
        int flow_buffsize = buffsize;
        try {
            flow_connect = (std::string)flow_config["bind"];
        } catch (JSMNUtilsEx &ex) {
            // bind stays default
        }
        try {
            flow_buffsize = (int)flow_config["buffsize"];
        } catch (JSMNUtilsEx &ex) {
            // buffsize stays default
        }
        int flow_port = flow_config["port"];
        //std::stringstream ss;
        //ss << flow_connect << ":" << flow_port;
        //flow_connect = ss.str(); // something like "tcp://localhost:5000"
        std::string filename = flow_config["file"];
        // Create flow
        WorkerFlow *flow = ws.create_flow(flow_name, flow_connect, flow_port,
                flow_buffsize);
        WorkerCallback *cb = new WorkerCallback(filename);
        flow->set_callback(cb);
        flow->own_callback(); // take care of it
        filename = filename;
        buffsize = buffsize;
    }

    // call the start method to loop workers.
    ws.start();
}